

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::SharedLibraryShellCommand::configureOutputs
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  pointer ppBVar1;
  BuildNode *pBVar2;
  BuildNode **output;
  pointer ppBVar3;
  StringRef local_60;
  string local_50;
  
  llbuild::buildsystem::ExternalCommand::configureOutputs(&this->super_ExternalCommand,ctx,value);
  ppBVar1 = (this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar3 = (this->super_ExternalCommand).super_Command.outputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar1;
      ppBVar3 = ppBVar3 + 1) {
    pBVar2 = *ppBVar3;
    if (pBVar2->type != Virtual) {
      if ((this->sharedLibName)._M_string_length == 0) {
        local_60.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
        local_60.Length = (pBVar2->super_Node).name._M_string_length;
        llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
        std::__cxx11::string::operator=((string *)&this->sharedLibName,(string *)&local_50);
        std::__cxx11::string::_M_dispose();
      }
      else {
        local_60.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
        local_60.Length = (pBVar2->super_Node).name._M_string_length;
        llvm::Twine::Twine((Twine *)&local_50,"unexpected explicit output: ",&local_60);
        llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_50);
      }
    }
  }
  if ((this->sharedLibName)._M_string_length == 0) {
    llvm::Twine::Twine((Twine *)&local_50,
                       "SharedLibraryTool requires the resulting shared library name to be specified"
                      );
    llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_50);
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    ExternalCommand::configureOutputs(ctx, value);

    for (const auto& output : getOutputs()) {
      if (!output->isVirtual()) {
        if (sharedLibName.empty()) {
          sharedLibName = output->getName();
        } else {
          ctx.error("unexpected explicit output: " + output->getName());
        }
      }
    }
    if (sharedLibName.empty()) {
      ctx.error("SharedLibraryTool requires the resulting shared library name "
                "to be specified");
    }
  }